

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O0

Matrix<double,_3,_3,_1,_3,_3> * iDynTree::unvecColMajor(Matrix<double,_9,_1,_0,_9,_1> *vec)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  Matrix<double,_3,_3,_1,_3,_3> *in_RDI;
  Matrix<double,_3,_3,_1,_3,_3> *mat;
  Index in_stack_ffffffffffffff98;
  double row;
  DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0> *in_stack_ffffffffffffffa0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *this;
  
  Eigen::Matrix<double,_3,_3,_1,_3,_3>::Matrix((Matrix<double,_3,_3,_1,_3,_3> *)0x6a11a0);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  row = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)
                      in_stack_ffffffffffffffa0,(Index)row,0x6a11c8);
  *pSVar3 = row;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     (in_stack_ffffffffffffffa0,(Index)row);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a11fd);
  *pSVar3 = (Scalar)this;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0> *)this,(Index)row);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a1233);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0> *)this,(Index)row);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a1269);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0> *)this,(Index)row);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a129e);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0> *)this,(Index)row);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a12d5);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0> *)this,(Index)row);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a130b);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0> *)this,(Index)row);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a1342);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0> *)this,(Index)row);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                     (this,(Index)row,0x6a1377);
  *pSVar3 = dVar1;
  return in_RDI;
}

Assistant:

Eigen::Matrix<double, 3, 3, Eigen::RowMajor> unvecColMajor(const Eigen::Matrix<double, 9, 1> & vec)
{
    Eigen::Matrix<double, 3, 3, Eigen::RowMajor> mat;

    mat(0,0) = vec(0);
    mat(1,0) = vec(1);
    mat(2,0) = vec(2);
    mat(0,1) = vec(3);
    mat(1,1) = vec(4);
    mat(2,1) = vec(5);
    mat(0,2) = vec(6);
    mat(1,2) = vec(7);
    mat(2,2) = vec(8);

    return mat;
}